

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decContext.cpp
# Opt level: O0

char * uprv_decContextStatusToString_63(decContext *context)

{
  uint32_t uVar1;
  int32_t status;
  decContext *context_local;
  
  uVar1 = context->status;
  if (uVar1 == 0x80) {
    context_local = (decContext *)anon_var_dwarf_10cee4;
  }
  else if (uVar1 == 2) {
    context_local = (decContext *)anon_var_dwarf_10ce60;
  }
  else if (uVar1 == 0x200) {
    context_local = (decContext *)anon_var_dwarf_10ceee;
  }
  else if (uVar1 == 0x2000) {
    context_local = (decContext *)anon_var_dwarf_10cf2e;
  }
  else if (uVar1 == 0x20) {
    context_local = (decContext *)anon_var_dwarf_10cea2;
  }
  else if (uVar1 == 4) {
    context_local = (decContext *)anon_var_dwarf_10ce76;
  }
  else if (uVar1 == 8) {
    context_local = (decContext *)anon_var_dwarf_10ce8c;
  }
  else if (uVar1 == 0x800) {
    context_local = (decContext *)anon_var_dwarf_10cf0e;
  }
  else if (uVar1 == 0x400) {
    context_local = (decContext *)anon_var_dwarf_10cf04;
  }
  else if (uVar1 == 0x1000) {
    context_local = (decContext *)0x43716d;
  }
  else if (uVar1 == 1) {
    context_local = (decContext *)anon_var_dwarf_10ce3d;
  }
  else if (uVar1 == 0x10) {
    context_local = (decContext *)anon_var_dwarf_10ceb8;
  }
  else if (uVar1 == 0x40) {
    context_local = (decContext *)anon_var_dwarf_10cece;
  }
  else if (uVar1 == 0) {
    context_local = (decContext *)anon_var_dwarf_10cf38;
  }
  else {
    context_local = (decContext *)anon_var_dwarf_10cf43;
  }
  return (char *)context_local;
}

Assistant:

U_CAPI const char * U_EXPORT2 uprv_decContextStatusToString(const decContext *context) {
  Int status=context->status;

  /* test the five IEEE first, as some of the others are ambiguous when  */
  /* DECEXTFLAG=0  */
  if (status==DEC_Invalid_operation    ) return DEC_Condition_IO;
  if (status==DEC_Division_by_zero     ) return DEC_Condition_DZ;
  if (status==DEC_Overflow             ) return DEC_Condition_OV;
  if (status==DEC_Underflow            ) return DEC_Condition_UN;
  if (status==DEC_Inexact              ) return DEC_Condition_IE;

  if (status==DEC_Division_impossible  ) return DEC_Condition_DI;
  if (status==DEC_Division_undefined   ) return DEC_Condition_DU;
  if (status==DEC_Rounded              ) return DEC_Condition_RO;
  if (status==DEC_Clamped              ) return DEC_Condition_PA;
  if (status==DEC_Subnormal            ) return DEC_Condition_SU;
  if (status==DEC_Conversion_syntax    ) return DEC_Condition_CS;
  if (status==DEC_Insufficient_storage ) return DEC_Condition_IS;
  if (status==DEC_Invalid_context      ) return DEC_Condition_IC;
  #if DECSUBSET
  if (status==DEC_Lost_digits          ) return DEC_Condition_LD;
  #endif
  if (status==0                        ) return DEC_Condition_ZE;
  return DEC_Condition_MU;  /* Multiple errors  */
  }